

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getEnterVals(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,SPxId enterId,
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *enterTest,
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *enterUB,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *enterLB,
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *enterVal,
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *enterMax,
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *enterPric,Status *enterStat,
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *enterRO,StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *objChange)

{
  Status SVar1;
  type_conflict5 tVar2;
  bool bVar3;
  int iVar4;
  undefined8 *puVar5;
  double *pdVar6;
  Status *pSVar7;
  SPxInternalCodeException *pSVar8;
  cpp_dec_float<50U,_int,_void> *u;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar9;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar11;
  cpp_dec_float<50U,_int,_void> *v;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  undefined4 uVar13;
  uint uVar14;
  long local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  SPxId enterId_local;
  int local_34c;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_308;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_288;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_248;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_208;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_188;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_148;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_110;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  enterId_local = enterId;
  if (enterId.super_DataKey.info < 1) {
    SPxRowId::SPxRowId((SPxRowId *)&result,&enterId_local);
    iVar4 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
            ::number(&(this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set,(DataKey *)&result);
    local_3b0 = (long)iVar4;
    *enterStat = (this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thedesc.rowstat.data[local_3b0];
    if (this->theRep == ROW) {
      computePvec(&result,this,iVar4);
      computeTest(&result,this,iVar4);
      *(ulong *)((enterTest->m_backend).data._M_elems + 8) =
           CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_);
      *(undefined8 *)((enterTest->m_backend).data._M_elems + 4) =
           result.m_backend.data._M_elems._16_8_;
      *(ulong *)((enterTest->m_backend).data._M_elems + 6) =
           CONCAT44(result.m_backend.data._M_elems[7],result.m_backend.data._M_elems[6]);
      *(undefined8 *)(enterTest->m_backend).data._M_elems = result.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((enterTest->m_backend).data._M_elems + 2) =
           result.m_backend.data._M_elems._8_8_;
      (enterTest->m_backend).exp = result.m_backend.exp;
      (enterTest->m_backend).neg = result.m_backend.neg;
      (enterTest->m_backend).fpclass = result.m_backend.fpclass;
      (enterTest->m_backend).prec_elem = result.m_backend.prec_elem;
      pVVar10 = &this->theTest;
    }
    else {
      pVVar10 = &this->theCoTest;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&enterTest->m_backend,
                 &(this->theCoTest).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&(pVVar10->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend,0);
    switch(*enterStat) {
    case D_FREE:
      pdVar6 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,*pdVar6,(type *)0x0);
      *(ulong *)((enterUB->m_backend).data._M_elems + 8) =
           CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_);
      (enterUB->m_backend).data._M_elems[4] = result.m_backend.data._M_elems[4];
      (enterUB->m_backend).data._M_elems[5] = result.m_backend.data._M_elems[5];
      (enterUB->m_backend).data._M_elems[6] = result.m_backend.data._M_elems[6];
      (enterUB->m_backend).data._M_elems[7] = result.m_backend.data._M_elems[7];
      (enterUB->m_backend).data._M_elems[0] = result.m_backend.data._M_elems[0];
      (enterUB->m_backend).data._M_elems[1] = result.m_backend.data._M_elems[1];
      (enterUB->m_backend).data._M_elems[2] = result.m_backend.data._M_elems[2];
      (enterUB->m_backend).data._M_elems[3] = result.m_backend.data._M_elems[3];
      (enterUB->m_backend).exp = result.m_backend.exp;
      (enterUB->m_backend).neg = result.m_backend.neg;
      (enterUB->m_backend).fpclass = result.m_backend.fpclass;
      (enterUB->m_backend).prec_elem = result.m_backend.prec_elem;
      pdVar6 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,-*pdVar6,(type *)0x0);
      *(ulong *)((enterLB->m_backend).data._M_elems + 8) =
           CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_);
      *(undefined8 *)((enterLB->m_backend).data._M_elems + 4) =
           result.m_backend.data._M_elems._16_8_;
      *(ulong *)((enterLB->m_backend).data._M_elems + 6) =
           CONCAT44(result.m_backend.data._M_elems[7],result.m_backend.data._M_elems[6]);
      *(undefined8 *)(enterLB->m_backend).data._M_elems = result.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((enterLB->m_backend).data._M_elems + 2) = result.m_backend.data._M_elems._8_8_
      ;
      (enterLB->m_backend).exp = result.m_backend.exp;
      (enterLB->m_backend).neg = result.m_backend.neg;
      (enterLB->m_backend).fpclass = result.m_backend.fpclass;
      (enterLB->m_backend).prec_elem = result.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&enterVal->m_backend,0);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&enterPric->m_backend,
                 &(this->thePvec->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&enterRO->m_backend,
                 &(this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .right.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
      tVar2 = boost::multiprecision::operator>(enterPric,enterRO);
      puVar5 = (undefined8 *)infinity();
      uVar14 = (uint)((ulong)*puVar5 >> 0x20);
      if (!tVar2) {
        uVar14 = uVar14 ^ 0x80000000;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,(double)CONCAT44(uVar14,(int)*puVar5),(type *)0x0);
      *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
           CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_);
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) =
           result.m_backend.data._M_elems._16_8_;
      *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
           CONCAT44(result.m_backend.data._M_elems[7],result.m_backend.data._M_elems[6]);
      *(undefined8 *)(enterMax->m_backend).data._M_elems = result.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) =
           result.m_backend.data._M_elems._8_8_;
      (enterMax->m_backend).exp = result.m_backend.exp;
      (enterMax->m_backend).neg = result.m_backend.neg;
      (enterMax->m_backend).fpclass = result.m_backend.fpclass;
      (enterMax->m_backend).prec_elem = result.m_backend.prec_elem;
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.rowstat.data[local_3b0] = P_FIXED;
      return;
    case D_ON_UPPER:
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&enterUB->m_backend,
                 &(this->theURbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
      pdVar6 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,-*pdVar6,(type *)0x0);
      *(ulong *)((enterLB->m_backend).data._M_elems + 8) =
           CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_);
      *(undefined8 *)((enterLB->m_backend).data._M_elems + 4) =
           result.m_backend.data._M_elems._16_8_;
      *(ulong *)((enterLB->m_backend).data._M_elems + 6) =
           CONCAT44(result.m_backend.data._M_elems[7],result.m_backend.data._M_elems[6]);
      *(undefined8 *)(enterLB->m_backend).data._M_elems = result.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((enterLB->m_backend).data._M_elems + 2) = result.m_backend.data._M_elems._8_8_
      ;
      (enterLB->m_backend).exp = result.m_backend.exp;
      (enterLB->m_backend).neg = result.m_backend.neg;
      (enterLB->m_backend).fpclass = result.m_backend.fpclass;
      (enterLB->m_backend).prec_elem = result.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&enterVal->m_backend,&enterUB->m_backend);
      pdVar6 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,-*pdVar6,(type *)0x0);
      *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
           CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_);
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) =
           result.m_backend.data._M_elems._16_8_;
      *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
           CONCAT44(result.m_backend.data._M_elems[7],result.m_backend.data._M_elems[6]);
      *(undefined8 *)(enterMax->m_backend).data._M_elems = result.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) =
           result.m_backend.data._M_elems._8_8_;
      (enterMax->m_backend).exp = result.m_backend.exp;
      (enterMax->m_backend).neg = result.m_backend.neg;
      (enterMax->m_backend).fpclass = result.m_backend.fpclass;
      (enterMax->m_backend).prec_elem = result.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&enterPric->m_backend,
                 &(this->thePvec->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&enterRO->m_backend,
                 &(this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .left.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 10;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems._32_5_ = 0;
      result.m_backend.data._M_elems[9]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result.m_backend,&enterRO->m_backend,&enterVal->m_backend);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)objChange,&result.m_backend);
      pSVar7 = (this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thedesc.rowstat.data;
      goto LAB_00225e59;
    case D_ON_LOWER:
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&enterLB->m_backend,
                 &(this->theLRbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
      pdVar6 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,*pdVar6,(type *)0x0);
      *(ulong *)((enterUB->m_backend).data._M_elems + 8) =
           CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_);
      *(undefined8 *)((enterUB->m_backend).data._M_elems + 4) =
           result.m_backend.data._M_elems._16_8_;
      *(ulong *)((enterUB->m_backend).data._M_elems + 6) =
           CONCAT44(result.m_backend.data._M_elems[7],result.m_backend.data._M_elems[6]);
      *(undefined8 *)(enterUB->m_backend).data._M_elems = result.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((enterUB->m_backend).data._M_elems + 2) = result.m_backend.data._M_elems._8_8_
      ;
      (enterUB->m_backend).exp = result.m_backend.exp;
      (enterUB->m_backend).neg = result.m_backend.neg;
      (enterUB->m_backend).fpclass = result.m_backend.fpclass;
      (enterUB->m_backend).prec_elem = result.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&enterVal->m_backend,&enterLB->m_backend);
      pdVar6 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,*pdVar6,(type *)0x0);
      *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
           CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_);
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) =
           result.m_backend.data._M_elems._16_8_;
      *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
           CONCAT44(result.m_backend.data._M_elems[7],result.m_backend.data._M_elems[6]);
      *(undefined8 *)(enterMax->m_backend).data._M_elems = result.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) =
           result.m_backend.data._M_elems._8_8_;
      (enterMax->m_backend).exp = result.m_backend.exp;
      (enterMax->m_backend).neg = result.m_backend.neg;
      (enterMax->m_backend).fpclass = result.m_backend.fpclass;
      (enterMax->m_backend).prec_elem = result.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&enterPric->m_backend,
                 &(this->thePvec->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&enterRO->m_backend,
                 &(this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .right.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 10;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems._32_5_ = 0;
      result.m_backend.data._M_elems[9]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result.m_backend,&enterRO->m_backend,&enterVal->m_backend);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)objChange,&result.m_backend);
      pSVar7 = (this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thedesc.rowstat.data;
      goto LAB_00225c03;
    case D_ON_BOTH:
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&enterPric->m_backend,
                 &(this->thePvec->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
      tVar2 = boost::multiprecision::operator>
                        (enterPric,
                         (this->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .right.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + local_3b0);
      if (tVar2) {
        pVVar10 = &(this->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .right;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (&enterLB->m_backend,
                   &(this->theLRbound).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (&enterVal->m_backend,&enterLB->m_backend);
        pdVar6 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&result.m_backend,*pdVar6,(type *)0x0);
        *(ulong *)((enterUB->m_backend).data._M_elems + 8) =
             CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_)
        ;
        (enterUB->m_backend).data._M_elems[4] = result.m_backend.data._M_elems[4];
        (enterUB->m_backend).data._M_elems[5] = result.m_backend.data._M_elems[5];
        (enterUB->m_backend).data._M_elems[6] = result.m_backend.data._M_elems[6];
        (enterUB->m_backend).data._M_elems[7] = result.m_backend.data._M_elems[7];
        (enterUB->m_backend).data._M_elems[0] = result.m_backend.data._M_elems[0];
        (enterUB->m_backend).data._M_elems[1] = result.m_backend.data._M_elems[1];
        (enterUB->m_backend).data._M_elems[2] = result.m_backend.data._M_elems[2];
        (enterUB->m_backend).data._M_elems[3] = result.m_backend.data._M_elems[3];
        (enterUB->m_backend).exp = result.m_backend.exp;
        (enterUB->m_backend).neg = result.m_backend.neg;
        (enterUB->m_backend).fpclass = result.m_backend.fpclass;
        (enterUB->m_backend).prec_elem = result.m_backend.prec_elem;
        pdVar6 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&result.m_backend,*pdVar6,(type *)0x0);
        *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
             CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_)
        ;
        *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) =
             result.m_backend.data._M_elems._16_8_;
        *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
             CONCAT44(result.m_backend.data._M_elems[7],result.m_backend.data._M_elems[6]);
        *(undefined8 *)(enterMax->m_backend).data._M_elems = result.m_backend.data._M_elems._0_8_;
        *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) =
             result.m_backend.data._M_elems._8_8_;
        (enterMax->m_backend).exp = result.m_backend.exp;
        (enterMax->m_backend).neg = result.m_backend.neg;
        (enterMax->m_backend).fpclass = result.m_backend.fpclass;
        (enterMax->m_backend).prec_elem = result.m_backend.prec_elem;
        SVar1 = P_ON_UPPER;
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (&enterUB->m_backend,
                   &(this->theURbound).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (&enterVal->m_backend,&enterUB->m_backend);
        pdVar6 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&result.m_backend,-*pdVar6,(type *)0x0);
        *(ulong *)((enterLB->m_backend).data._M_elems + 8) =
             CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_)
        ;
        (enterLB->m_backend).data._M_elems[4] = result.m_backend.data._M_elems[4];
        (enterLB->m_backend).data._M_elems[5] = result.m_backend.data._M_elems[5];
        (enterLB->m_backend).data._M_elems[6] = result.m_backend.data._M_elems[6];
        (enterLB->m_backend).data._M_elems[7] = result.m_backend.data._M_elems[7];
        (enterLB->m_backend).data._M_elems[0] = result.m_backend.data._M_elems[0];
        (enterLB->m_backend).data._M_elems[1] = result.m_backend.data._M_elems[1];
        (enterLB->m_backend).data._M_elems[2] = result.m_backend.data._M_elems[2];
        (enterLB->m_backend).data._M_elems[3] = result.m_backend.data._M_elems[3];
        (enterLB->m_backend).exp = result.m_backend.exp;
        (enterLB->m_backend).neg = result.m_backend.neg;
        (enterLB->m_backend).fpclass = result.m_backend.fpclass;
        (enterLB->m_backend).prec_elem = result.m_backend.prec_elem;
        pdVar6 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&result.m_backend,-*pdVar6,(type *)0x0);
        *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
             CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_)
        ;
        *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) =
             result.m_backend.data._M_elems._16_8_;
        *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
             CONCAT44(result.m_backend.data._M_elems[7],result.m_backend.data._M_elems[6]);
        *(undefined8 *)(enterMax->m_backend).data._M_elems = result.m_backend.data._M_elems._0_8_;
        *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) =
             result.m_backend.data._M_elems._8_8_;
        (enterMax->m_backend).exp = result.m_backend.exp;
        (enterMax->m_backend).neg = result.m_backend.neg;
        (enterMax->m_backend).fpclass = result.m_backend.fpclass;
        (enterMax->m_backend).prec_elem = result.m_backend.prec_elem;
        pVVar10 = &(this->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .left;
        SVar1 = P_ON_LOWER;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&enterRO->m_backend,
                 &(pVVar10->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.rowstat.data[local_3b0] = SVar1;
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 10;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems._32_5_ = 0;
      result.m_backend.data._M_elems[9]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result.m_backend,
                 &(this->theLRbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend,
                 &(this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .right.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)objChange,&result.m_backend);
      u = &(this->theURbound).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend;
      v = &(this->
           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .left.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend;
      goto LAB_002263e4;
    case P_ON_LOWER:
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&enterUB->m_backend,
                 &(this->theURbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&enterLB->m_backend,
                 &(this->theLRbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&enterVal->m_backend,&enterUB->m_backend);
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 10;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems._32_5_ = 0;
      result.m_backend.data._M_elems[9]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result.m_backend,&enterLB->m_backend,&enterUB->m_backend);
      *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
           CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_);
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) =
           result.m_backend.data._M_elems._16_8_;
      *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
           CONCAT44(result.m_backend.data._M_elems[7],result.m_backend.data._M_elems[6]);
      *(undefined8 *)(enterMax->m_backend).data._M_elems = result.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) =
           result.m_backend.data._M_elems._8_8_;
      (enterMax->m_backend).exp = result.m_backend.exp;
      (enterMax->m_backend).neg = result.m_backend.neg;
      (enterMax->m_backend).fpclass = result.m_backend.fpclass;
      (enterMax->m_backend).prec_elem = result.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&enterPric->m_backend,
                 &(this->theCoPvec->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&enterRO->m_backend,
                 &(this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .object.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 10;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems._32_5_ = 0;
      result.m_backend.data._M_elems[9]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result.m_backend,&enterRO->m_backend,&enterVal->m_backend);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)objChange,&result.m_backend);
      pdVar6 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,-*pdVar6,(type *)0x0);
      tVar2 = boost::multiprecision::operator<=
                        (enterLB,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&result.m_backend);
      if (tVar2) {
        pSVar7 = (this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thedesc.rowstat.data;
        goto LAB_002250f6;
      }
      local_2c8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((enterLB->m_backend).data._M_elems + 8);
      pnVar11 = &local_2c8;
      local_2c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(enterLB->m_backend).data._M_elems;
      local_2c8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((enterLB->m_backend).data._M_elems + 2);
      local_2c8.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((enterLB->m_backend).data._M_elems + 4);
      local_2c8.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((enterLB->m_backend).data._M_elems + 6);
      local_2c8.m_backend.exp = (enterLB->m_backend).exp;
      local_2c8.m_backend.neg = (enterLB->m_backend).neg;
      local_2c8.m_backend.fpclass = (enterLB->m_backend).fpclass;
      local_2c8.m_backend.prec_elem = (enterLB->m_backend).prec_elem;
      local_308.m_backend.data._M_elems._0_8_ = *(undefined8 *)(enterUB->m_backend).data._M_elems;
      local_308.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((enterUB->m_backend).data._M_elems + 2);
      local_308.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((enterUB->m_backend).data._M_elems + 4);
      local_308.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((enterUB->m_backend).data._M_elems + 6);
      pnVar12 = &local_308;
      local_308.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((enterUB->m_backend).data._M_elems + 8);
      local_308.m_backend.exp = (enterUB->m_backend).exp;
      local_308.m_backend.neg = (enterUB->m_backend).neg;
      local_308.m_backend.fpclass = (enterUB->m_backend).fpclass;
      local_308.m_backend.prec_elem = (enterUB->m_backend).prec_elem;
      pnVar9 = &local_110;
      break;
    default:
      pSVar8 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&result,"XENTER03 This should never happen.",(allocator *)&result_4);
      SPxInternalCodeException::SPxInternalCodeException(pSVar8,(string *)&result);
      __cxa_throw(pSVar8,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    case P_ON_UPPER:
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&enterUB->m_backend,
                 &(this->theURbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&enterLB->m_backend,
                 &(this->theLRbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&enterVal->m_backend,&enterLB->m_backend);
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 10;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems._32_5_ = 0;
      result.m_backend.data._M_elems[9]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result.m_backend,&enterUB->m_backend,&enterLB->m_backend);
      *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
           CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_);
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) =
           result.m_backend.data._M_elems._16_8_;
      *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
           CONCAT44(result.m_backend.data._M_elems[7],result.m_backend.data._M_elems[6]);
      *(undefined8 *)(enterMax->m_backend).data._M_elems = result.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) =
           result.m_backend.data._M_elems._8_8_;
      (enterMax->m_backend).exp = result.m_backend.exp;
      (enterMax->m_backend).neg = result.m_backend.neg;
      (enterMax->m_backend).fpclass = result.m_backend.fpclass;
      (enterMax->m_backend).prec_elem = result.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&enterPric->m_backend,
                 &(this->theCoPvec->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&enterRO->m_backend,
                 &(this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .object.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 10;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems._32_5_ = 0;
      result.m_backend.data._M_elems[9]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result.m_backend,&enterRO->m_backend,&enterVal->m_backend);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)objChange,&result.m_backend);
      pdVar6 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,*pdVar6,(type *)0x0);
      tVar2 = boost::multiprecision::operator>=
                        (enterUB,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&result.m_backend);
      if (tVar2) {
        pSVar7 = (this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thedesc.rowstat.data;
        goto LAB_00225ab6;
      }
      local_248.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((enterLB->m_backend).data._M_elems + 8);
      pnVar11 = &local_248;
      local_248.m_backend.data._M_elems._0_8_ = *(undefined8 *)(enterLB->m_backend).data._M_elems;
      local_248.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((enterLB->m_backend).data._M_elems + 2);
      local_248.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((enterLB->m_backend).data._M_elems + 4);
      local_248.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((enterLB->m_backend).data._M_elems + 6);
      local_248.m_backend.exp = (enterLB->m_backend).exp;
      local_248.m_backend.neg = (enterLB->m_backend).neg;
      local_248.m_backend.fpclass = (enterLB->m_backend).fpclass;
      local_248.m_backend.prec_elem = (enterLB->m_backend).prec_elem;
      local_288.m_backend.data._M_elems._0_8_ = *(undefined8 *)(enterUB->m_backend).data._M_elems;
      local_288.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((enterUB->m_backend).data._M_elems + 2);
      local_288.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((enterUB->m_backend).data._M_elems + 4);
      local_288.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((enterUB->m_backend).data._M_elems + 6);
      pnVar12 = &local_288;
      local_288.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((enterUB->m_backend).data._M_elems + 8);
      local_288.m_backend.exp = (enterUB->m_backend).exp;
      local_288.m_backend.neg = (enterUB->m_backend).neg;
      local_288.m_backend.fpclass = (enterUB->m_backend).fpclass;
      local_288.m_backend.prec_elem = (enterUB->m_backend).prec_elem;
      pnVar9 = &local_d8;
      break;
    case P_FREE:
      pSVar8 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&result,"XENTER02 This should never happen.",(allocator *)&result_4);
      SPxInternalCodeException::SPxInternalCodeException(pSVar8,(string *)&result);
      __cxa_throw(pSVar8,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    epsilon(pnVar9,this);
    bVar3 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (pnVar11,pnVar12,pnVar9);
    pSVar7 = (this->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thedesc.rowstat.data;
    goto LAB_00226271;
  }
  SPxColId::SPxColId((SPxColId *)&result,&enterId_local);
  iVar4 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
          ::number(&(this->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set,(DataKey *)&result);
  local_3b0 = (long)iVar4;
  *enterStat = (this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thedesc.colstat.data[local_3b0];
  if (this->theRep == COLUMN) {
    computePvec(&result,this,iVar4);
    computeTest(&result,this,iVar4);
    *(ulong *)((enterTest->m_backend).data._M_elems + 8) =
         CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_);
    *(undefined8 *)((enterTest->m_backend).data._M_elems + 4) =
         result.m_backend.data._M_elems._16_8_;
    *(ulong *)((enterTest->m_backend).data._M_elems + 6) =
         CONCAT44(result.m_backend.data._M_elems[7],result.m_backend.data._M_elems[6]);
    *(undefined8 *)(enterTest->m_backend).data._M_elems = result.m_backend.data._M_elems._0_8_;
    *(undefined8 *)((enterTest->m_backend).data._M_elems + 2) = result.m_backend.data._M_elems._8_8_
    ;
    (enterTest->m_backend).exp = result.m_backend.exp;
    (enterTest->m_backend).neg = result.m_backend.neg;
    (enterTest->m_backend).fpclass = result.m_backend.fpclass;
    (enterTest->m_backend).prec_elem = result.m_backend.prec_elem;
    pVVar10 = &this->theTest;
  }
  else {
    pVVar10 = &this->theCoTest;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&enterTest->m_backend,
               &(this->theCoTest).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
            (&(pVVar10->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend,0);
  switch(*enterStat) {
  case D_FREE:
    pdVar6 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&result.m_backend,*pdVar6,(type *)0x0);
    *(ulong *)((enterUB->m_backend).data._M_elems + 8) =
         CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_);
    (enterUB->m_backend).data._M_elems[4] = result.m_backend.data._M_elems[4];
    (enterUB->m_backend).data._M_elems[5] = result.m_backend.data._M_elems[5];
    (enterUB->m_backend).data._M_elems[6] = result.m_backend.data._M_elems[6];
    (enterUB->m_backend).data._M_elems[7] = result.m_backend.data._M_elems[7];
    (enterUB->m_backend).data._M_elems[0] = result.m_backend.data._M_elems[0];
    (enterUB->m_backend).data._M_elems[1] = result.m_backend.data._M_elems[1];
    (enterUB->m_backend).data._M_elems[2] = result.m_backend.data._M_elems[2];
    (enterUB->m_backend).data._M_elems[3] = result.m_backend.data._M_elems[3];
    (enterUB->m_backend).exp = result.m_backend.exp;
    (enterUB->m_backend).neg = result.m_backend.neg;
    (enterUB->m_backend).fpclass = result.m_backend.fpclass;
    (enterUB->m_backend).prec_elem = result.m_backend.prec_elem;
    pdVar6 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&result.m_backend,-*pdVar6,(type *)0x0);
    *(ulong *)((enterLB->m_backend).data._M_elems + 8) =
         CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_);
    *(undefined8 *)((enterLB->m_backend).data._M_elems + 4) = result.m_backend.data._M_elems._16_8_;
    *(ulong *)((enterLB->m_backend).data._M_elems + 6) =
         CONCAT44(result.m_backend.data._M_elems[7],result.m_backend.data._M_elems[6]);
    *(undefined8 *)(enterLB->m_backend).data._M_elems = result.m_backend.data._M_elems._0_8_;
    *(undefined8 *)((enterLB->m_backend).data._M_elems + 2) = result.m_backend.data._M_elems._8_8_;
    (enterLB->m_backend).exp = result.m_backend.exp;
    (enterLB->m_backend).neg = result.m_backend.neg;
    (enterLB->m_backend).fpclass = result.m_backend.fpclass;
    (enterLB->m_backend).prec_elem = result.m_backend.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&enterVal->m_backend,0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&enterRO->m_backend,
               &(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .up.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&enterPric->m_backend,
               &(this->theCoPvec->
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
    tVar2 = boost::multiprecision::operator>(enterPric,enterRO);
    if (tVar2) {
      puVar5 = (undefined8 *)infinity();
      uVar13 = (undefined4)*puVar5;
      uVar14 = (uint)((ulong)*puVar5 >> 0x20);
    }
    else {
      puVar5 = (undefined8 *)infinity();
      uVar13 = (undefined4)*puVar5;
      uVar14 = (uint)((ulong)*puVar5 >> 0x20) ^ 0x80000000;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&result.m_backend,(double)CONCAT44(uVar14,uVar13),(type *)0x0);
    *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
         CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_);
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = result.m_backend.data._M_elems._16_8_
    ;
    *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
         CONCAT44(result.m_backend.data._M_elems[7],result.m_backend.data._M_elems[6]);
    *(undefined8 *)(enterMax->m_backend).data._M_elems = result.m_backend.data._M_elems._0_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = result.m_backend.data._M_elems._8_8_;
    (enterMax->m_backend).exp = result.m_backend.exp;
    (enterMax->m_backend).neg = result.m_backend.neg;
    (enterMax->m_backend).fpclass = result.m_backend.fpclass;
    (enterMax->m_backend).prec_elem = result.m_backend.prec_elem;
    (this->
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thedesc.colstat.data[local_3b0] = P_FIXED;
    break;
  case D_ON_UPPER:
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&enterUB->m_backend,
               &(this->theUCbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
    pdVar6 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&result.m_backend,-*pdVar6,(type *)0x0);
    *(ulong *)((enterLB->m_backend).data._M_elems + 8) =
         CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_);
    (enterLB->m_backend).data._M_elems[4] = result.m_backend.data._M_elems[4];
    (enterLB->m_backend).data._M_elems[5] = result.m_backend.data._M_elems[5];
    (enterLB->m_backend).data._M_elems[6] = result.m_backend.data._M_elems[6];
    (enterLB->m_backend).data._M_elems[7] = result.m_backend.data._M_elems[7];
    (enterLB->m_backend).data._M_elems[0] = result.m_backend.data._M_elems[0];
    (enterLB->m_backend).data._M_elems[1] = result.m_backend.data._M_elems[1];
    (enterLB->m_backend).data._M_elems[2] = result.m_backend.data._M_elems[2];
    (enterLB->m_backend).data._M_elems[3] = result.m_backend.data._M_elems[3];
    (enterLB->m_backend).exp = result.m_backend.exp;
    (enterLB->m_backend).neg = result.m_backend.neg;
    (enterLB->m_backend).fpclass = result.m_backend.fpclass;
    (enterLB->m_backend).prec_elem = result.m_backend.prec_elem;
    pdVar6 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&result.m_backend,-*pdVar6,(type *)0x0);
    *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
         CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_);
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = result.m_backend.data._M_elems._16_8_
    ;
    *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
         CONCAT44(result.m_backend.data._M_elems[7],result.m_backend.data._M_elems[6]);
    *(undefined8 *)(enterMax->m_backend).data._M_elems = result.m_backend.data._M_elems._0_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = result.m_backend.data._M_elems._8_8_;
    (enterMax->m_backend).exp = result.m_backend.exp;
    (enterMax->m_backend).neg = result.m_backend.neg;
    (enterMax->m_backend).fpclass = result.m_backend.fpclass;
    (enterMax->m_backend).prec_elem = result.m_backend.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&enterVal->m_backend,&enterUB->m_backend);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&enterPric->m_backend,
               &(this->theCoPvec->
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&enterRO->m_backend,
               &(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .low.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 10;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems[6] = 0;
    result.m_backend.data._M_elems[7] = 0;
    result.m_backend.data._M_elems._32_5_ = 0;
    result.m_backend.data._M_elems[9]._1_3_ = 0;
    result.m_backend.exp = 0;
    result.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&result.m_backend,&enterRO->m_backend,&enterVal->m_backend);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
              ((cpp_dec_float<50U,_int,_void> *)objChange,&result.m_backend);
    pSVar7 = (this->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thedesc.colstat.data;
LAB_00225e59:
    pSVar7[local_3b0] = P_ON_LOWER;
    break;
  case D_ON_LOWER:
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&enterLB->m_backend,
               &(this->theLCbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
    pdVar6 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&result.m_backend,*pdVar6,(type *)0x0);
    *(ulong *)((enterUB->m_backend).data._M_elems + 8) =
         CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_);
    (enterUB->m_backend).data._M_elems[4] = result.m_backend.data._M_elems[4];
    (enterUB->m_backend).data._M_elems[5] = result.m_backend.data._M_elems[5];
    (enterUB->m_backend).data._M_elems[6] = result.m_backend.data._M_elems[6];
    (enterUB->m_backend).data._M_elems[7] = result.m_backend.data._M_elems[7];
    (enterUB->m_backend).data._M_elems[0] = result.m_backend.data._M_elems[0];
    (enterUB->m_backend).data._M_elems[1] = result.m_backend.data._M_elems[1];
    (enterUB->m_backend).data._M_elems[2] = result.m_backend.data._M_elems[2];
    (enterUB->m_backend).data._M_elems[3] = result.m_backend.data._M_elems[3];
    (enterUB->m_backend).exp = result.m_backend.exp;
    (enterUB->m_backend).neg = result.m_backend.neg;
    (enterUB->m_backend).fpclass = result.m_backend.fpclass;
    (enterUB->m_backend).prec_elem = result.m_backend.prec_elem;
    pdVar6 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&result.m_backend,*pdVar6,(type *)0x0);
    *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
         CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_);
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = result.m_backend.data._M_elems._16_8_
    ;
    *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
         CONCAT44(result.m_backend.data._M_elems[7],result.m_backend.data._M_elems[6]);
    *(undefined8 *)(enterMax->m_backend).data._M_elems = result.m_backend.data._M_elems._0_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = result.m_backend.data._M_elems._8_8_;
    (enterMax->m_backend).exp = result.m_backend.exp;
    (enterMax->m_backend).neg = result.m_backend.neg;
    (enterMax->m_backend).fpclass = result.m_backend.fpclass;
    (enterMax->m_backend).prec_elem = result.m_backend.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&enterVal->m_backend,&enterLB->m_backend);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&enterPric->m_backend,
               &(this->theCoPvec->
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&enterRO->m_backend,
               &(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .up.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 10;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems[6] = 0;
    result.m_backend.data._M_elems[7] = 0;
    result.m_backend.data._M_elems._32_5_ = 0;
    result.m_backend.data._M_elems[9]._1_3_ = 0;
    result.m_backend.exp = 0;
    result.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&result.m_backend,&enterRO->m_backend,&enterVal->m_backend);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
              ((cpp_dec_float<50U,_int,_void> *)objChange,&result.m_backend);
    pSVar7 = (this->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thedesc.colstat.data;
LAB_00225c03:
    pSVar7[local_3b0] = P_ON_UPPER;
    break;
  case D_ON_BOTH:
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&enterPric->m_backend,
               &(this->theCoPvec->
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
    tVar2 = boost::multiprecision::operator>
                      (enterPric,
                       (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .up.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + local_3b0);
    if (tVar2) {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&enterLB->m_backend,
                 &(this->theLCbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
      pdVar6 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,*pdVar6,(type *)0x0);
      *(ulong *)((enterUB->m_backend).data._M_elems + 8) =
           CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_);
      (enterUB->m_backend).data._M_elems[4] = result.m_backend.data._M_elems[4];
      (enterUB->m_backend).data._M_elems[5] = result.m_backend.data._M_elems[5];
      (enterUB->m_backend).data._M_elems[6] = result.m_backend.data._M_elems[6];
      (enterUB->m_backend).data._M_elems[7] = result.m_backend.data._M_elems[7];
      (enterUB->m_backend).data._M_elems[0] = result.m_backend.data._M_elems[0];
      (enterUB->m_backend).data._M_elems[1] = result.m_backend.data._M_elems[1];
      (enterUB->m_backend).data._M_elems[2] = result.m_backend.data._M_elems[2];
      (enterUB->m_backend).data._M_elems[3] = result.m_backend.data._M_elems[3];
      (enterUB->m_backend).exp = result.m_backend.exp;
      (enterUB->m_backend).neg = result.m_backend.neg;
      (enterUB->m_backend).fpclass = result.m_backend.fpclass;
      (enterUB->m_backend).prec_elem = result.m_backend.prec_elem;
      pdVar6 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,*pdVar6,(type *)0x0);
      *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
           CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_);
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) =
           result.m_backend.data._M_elems._16_8_;
      *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
           CONCAT44(result.m_backend.data._M_elems[7],result.m_backend.data._M_elems[6]);
      *(undefined8 *)(enterMax->m_backend).data._M_elems = result.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) =
           result.m_backend.data._M_elems._8_8_;
      (enterMax->m_backend).exp = result.m_backend.exp;
      (enterMax->m_backend).neg = result.m_backend.neg;
      (enterMax->m_backend).fpclass = result.m_backend.fpclass;
      (enterMax->m_backend).prec_elem = result.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&enterVal->m_backend,&enterLB->m_backend);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&enterRO->m_backend,
                 &(this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .up.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
      SVar1 = P_ON_UPPER;
    }
    else {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&enterUB->m_backend,
                 &(this->theUCbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&enterVal->m_backend,&enterUB->m_backend);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&enterRO->m_backend,
                 &(this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .low.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
      pdVar6 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,-*pdVar6,(type *)0x0);
      *(ulong *)((enterLB->m_backend).data._M_elems + 8) =
           CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_);
      (enterLB->m_backend).data._M_elems[4] = result.m_backend.data._M_elems[4];
      (enterLB->m_backend).data._M_elems[5] = result.m_backend.data._M_elems[5];
      (enterLB->m_backend).data._M_elems[6] = result.m_backend.data._M_elems[6];
      (enterLB->m_backend).data._M_elems[7] = result.m_backend.data._M_elems[7];
      (enterLB->m_backend).data._M_elems[0] = result.m_backend.data._M_elems[0];
      (enterLB->m_backend).data._M_elems[1] = result.m_backend.data._M_elems[1];
      (enterLB->m_backend).data._M_elems[2] = result.m_backend.data._M_elems[2];
      (enterLB->m_backend).data._M_elems[3] = result.m_backend.data._M_elems[3];
      (enterLB->m_backend).exp = result.m_backend.exp;
      (enterLB->m_backend).neg = result.m_backend.neg;
      (enterLB->m_backend).fpclass = result.m_backend.fpclass;
      (enterLB->m_backend).prec_elem = result.m_backend.prec_elem;
      pdVar6 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,-*pdVar6,(type *)0x0);
      *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
           CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_);
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) =
           result.m_backend.data._M_elems._16_8_;
      *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
           CONCAT44(result.m_backend.data._M_elems[7],result.m_backend.data._M_elems[6]);
      *(undefined8 *)(enterMax->m_backend).data._M_elems = result.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) =
           result.m_backend.data._M_elems._8_8_;
      (enterMax->m_backend).exp = result.m_backend.exp;
      (enterMax->m_backend).neg = result.m_backend.neg;
      (enterMax->m_backend).fpclass = result.m_backend.fpclass;
      (enterMax->m_backend).prec_elem = result.m_backend.prec_elem;
      SVar1 = P_ON_LOWER;
    }
    (this->
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thedesc.colstat.data[local_3b0] = SVar1;
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 10;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems[6] = 0;
    result.m_backend.data._M_elems[7] = 0;
    result.m_backend.data._M_elems._32_5_ = 0;
    result.m_backend.data._M_elems[9]._1_3_ = 0;
    result.m_backend.exp = 0;
    result.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&result.m_backend,
               &(this->theLCbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend,
               &(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .up.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
              ((cpp_dec_float<50U,_int,_void> *)objChange,&result.m_backend);
    u = &(this->theUCbound).val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend;
    v = &(this->
         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).
         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         .low.val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend;
LAB_002263e4:
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 10;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems[6] = 0;
    result.m_backend.data._M_elems[7] = 0;
    result.m_backend.data._M_elems._32_5_ = 0;
    result.m_backend.data._M_elems[9]._1_3_ = 0;
    result.m_backend.exp = 0;
    result.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&result.m_backend,u,v);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
              ((cpp_dec_float<50U,_int,_void> *)objChange,&result.m_backend);
    break;
  case P_ON_LOWER:
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&enterUB->m_backend,
               &(this->theUCbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&enterLB->m_backend,
               &(this->theLCbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&enterVal->m_backend,&enterLB->m_backend);
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 10;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems[6] = 0;
    result.m_backend.data._M_elems[7] = 0;
    result.m_backend.data._M_elems._32_5_ = 0;
    result.m_backend.data._M_elems[9]._1_3_ = 0;
    result.m_backend.exp = 0;
    result.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&result.m_backend,&enterUB->m_backend,&enterLB->m_backend);
    *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
         CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_);
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = result.m_backend.data._M_elems._16_8_
    ;
    *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
         CONCAT44(result.m_backend.data._M_elems[7],result.m_backend.data._M_elems[6]);
    *(undefined8 *)(enterMax->m_backend).data._M_elems = result.m_backend.data._M_elems._0_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = result.m_backend.data._M_elems._8_8_;
    (enterMax->m_backend).exp = result.m_backend.exp;
    (enterMax->m_backend).neg = result.m_backend.neg;
    (enterMax->m_backend).fpclass = result.m_backend.fpclass;
    (enterMax->m_backend).prec_elem = result.m_backend.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&enterPric->m_backend,
               &(this->thePvec->
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&enterRO->m_backend,
               &(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .object.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 10;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems[6] = 0;
    result.m_backend.data._M_elems[7] = 0;
    result.m_backend.data._M_elems._32_5_ = 0;
    result.m_backend.data._M_elems[9]._1_3_ = 0;
    result.m_backend.exp = 0;
    result.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&result.m_backend,&enterVal->m_backend,&enterRO->m_backend);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
              ((cpp_dec_float<50U,_int,_void> *)objChange,&result.m_backend);
    pdVar6 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&result.m_backend,*pdVar6,(type *)0x0);
    tVar2 = boost::multiprecision::operator>=
                      (enterUB,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&result.m_backend);
    if (tVar2) {
      pSVar7 = (this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thedesc.colstat.data;
LAB_002250f6:
      pSVar7[local_3b0] = D_ON_UPPER;
      return;
    }
    local_1c8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((enterLB->m_backend).data._M_elems + 8);
    pnVar11 = &local_1c8;
    local_1c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(enterLB->m_backend).data._M_elems;
    local_1c8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((enterLB->m_backend).data._M_elems + 2);
    local_1c8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((enterLB->m_backend).data._M_elems + 4);
    local_1c8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((enterLB->m_backend).data._M_elems + 6);
    local_1c8.m_backend.exp = (enterLB->m_backend).exp;
    local_1c8.m_backend.neg = (enterLB->m_backend).neg;
    local_1c8.m_backend.fpclass = (enterLB->m_backend).fpclass;
    local_1c8.m_backend.prec_elem = (enterLB->m_backend).prec_elem;
    local_208.m_backend.data._M_elems._0_8_ = *(undefined8 *)(enterUB->m_backend).data._M_elems;
    local_208.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((enterUB->m_backend).data._M_elems + 2);
    local_208.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((enterUB->m_backend).data._M_elems + 4);
    local_208.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((enterUB->m_backend).data._M_elems + 6);
    pnVar12 = &local_208;
    local_208.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((enterUB->m_backend).data._M_elems + 8);
    local_208.m_backend.exp = (enterUB->m_backend).exp;
    local_208.m_backend.neg = (enterUB->m_backend).neg;
    local_208.m_backend.fpclass = (enterUB->m_backend).fpclass;
    local_208.m_backend.prec_elem = (enterUB->m_backend).prec_elem;
    pnVar9 = &local_a0;
    goto LAB_00225fd8;
  default:
    pSVar8 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&result,"XENTER01 This should never happen.",(allocator *)&result_4);
    SPxInternalCodeException::SPxInternalCodeException(pSVar8,(string *)&result);
    __cxa_throw(pSVar8,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  case P_ON_UPPER:
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&enterUB->m_backend,
               &(this->theUCbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&enterLB->m_backend,
               &(this->theLCbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&enterVal->m_backend,&enterUB->m_backend);
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 10;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems[6] = 0;
    result.m_backend.data._M_elems[7] = 0;
    result.m_backend.data._M_elems._32_5_ = 0;
    result.m_backend.data._M_elems[9]._1_3_ = 0;
    result.m_backend.exp = 0;
    result.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&result.m_backend,&enterLB->m_backend,&enterUB->m_backend);
    *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
         CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_);
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = result.m_backend.data._M_elems._16_8_
    ;
    *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
         CONCAT44(result.m_backend.data._M_elems[7],result.m_backend.data._M_elems[6]);
    *(undefined8 *)(enterMax->m_backend).data._M_elems = result.m_backend.data._M_elems._0_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = result.m_backend.data._M_elems._8_8_;
    (enterMax->m_backend).exp = result.m_backend.exp;
    (enterMax->m_backend).neg = result.m_backend.neg;
    (enterMax->m_backend).fpclass = result.m_backend.fpclass;
    (enterMax->m_backend).prec_elem = result.m_backend.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&enterPric->m_backend,
               &(this->thePvec->
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&enterRO->m_backend,
               &(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .object.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 10;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems[6] = 0;
    result.m_backend.data._M_elems[7] = 0;
    result.m_backend.data._M_elems._32_5_ = 0;
    result.m_backend.data._M_elems[9]._1_3_ = 0;
    result.m_backend.exp = 0;
    result.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&result.m_backend,&enterVal->m_backend,&enterRO->m_backend);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
              ((cpp_dec_float<50U,_int,_void> *)objChange,&result.m_backend);
    pdVar6 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&result.m_backend,-*pdVar6,(type *)0x0);
    tVar2 = boost::multiprecision::operator<=
                      (enterLB,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&result.m_backend);
    if (tVar2) {
      pSVar7 = (this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thedesc.colstat.data;
LAB_00225ab6:
      pSVar7[local_3b0] = D_ON_LOWER;
      return;
    }
    local_148.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((enterLB->m_backend).data._M_elems + 8);
    pnVar11 = &local_148;
    local_148.m_backend.data._M_elems._0_8_ = *(undefined8 *)(enterLB->m_backend).data._M_elems;
    local_148.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((enterLB->m_backend).data._M_elems + 2);
    local_148.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((enterLB->m_backend).data._M_elems + 4);
    local_148.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((enterLB->m_backend).data._M_elems + 6);
    local_148.m_backend.exp = (enterLB->m_backend).exp;
    local_148.m_backend.neg = (enterLB->m_backend).neg;
    local_148.m_backend.fpclass = (enterLB->m_backend).fpclass;
    local_148.m_backend.prec_elem = (enterLB->m_backend).prec_elem;
    local_188.m_backend.data._M_elems._0_8_ = *(undefined8 *)(enterUB->m_backend).data._M_elems;
    local_188.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((enterUB->m_backend).data._M_elems + 2);
    local_188.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((enterUB->m_backend).data._M_elems + 4);
    local_188.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((enterUB->m_backend).data._M_elems + 6);
    pnVar12 = &local_188;
    local_188.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((enterUB->m_backend).data._M_elems + 8);
    local_188.m_backend.exp = (enterUB->m_backend).exp;
    local_188.m_backend.neg = (enterUB->m_backend).neg;
    local_188.m_backend.fpclass = (enterUB->m_backend).fpclass;
    local_188.m_backend.prec_elem = (enterUB->m_backend).prec_elem;
    pnVar9 = &local_68;
LAB_00225fd8:
    epsilon(pnVar9,this);
    bVar3 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (pnVar11,pnVar12,pnVar9);
    pSVar7 = (this->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thedesc.colstat.data;
LAB_00226271:
    if (bVar3 == false) {
      pSVar7[local_3b0] = D_ON_BOTH;
    }
    else {
      pSVar7[local_3b0] = D_FREE;
    }
    break;
  case P_FREE:
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&enterUB->m_backend,
               &(this->theUCbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&enterLB->m_backend,
               &(this->theLCbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&enterVal->m_backend,0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&enterPric->m_backend,
               &(this->thePvec->
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&enterRO->m_backend,
               &(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .object.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_3b0].m_backend);
    (this->
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thedesc.colstat.data[local_3b0] = D_UNDEFINED;
    result_4.m_backend.fpclass = cpp_dec_float_finite;
    result_4.m_backend.prec_elem = 10;
    result_4.m_backend.data._M_elems[0] = 0;
    result_4.m_backend.data._M_elems[1] = 0;
    result_4.m_backend.data._M_elems[2] = 0;
    result_4.m_backend.data._M_elems[3] = 0;
    result_4.m_backend.data._M_elems[4] = 0;
    result_4.m_backend.data._M_elems[5] = 0;
    result_4.m_backend.data._M_elems._24_5_ = 0;
    result_4.m_backend.data._M_elems[7]._1_3_ = 0;
    result_4.m_backend.data._M_elems._32_5_ = 0;
    result_4.m_backend._37_8_ = 0;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&result_4.m_backend,&enterRO->m_backend,&enterPric->m_backend);
    local_34c = 0;
    tVar2 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&result_4.m_backend,&local_34c);
    puVar5 = (undefined8 *)infinity();
    uVar14 = (uint)((ulong)*puVar5 >> 0x20);
    if (!tVar2) {
      uVar14 = uVar14 ^ 0x80000000;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&result.m_backend,(double)CONCAT44(uVar14,(int)*puVar5),(type *)0x0);
    *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
         CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_);
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = result.m_backend.data._M_elems._16_8_
    ;
    *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
         CONCAT44(result.m_backend.data._M_elems[7],result.m_backend.data._M_elems[6]);
    *(undefined8 *)(enterMax->m_backend).data._M_elems = result.m_backend.data._M_elems._0_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = result.m_backend.data._M_elems._8_8_;
    (enterMax->m_backend).exp = result.m_backend.exp;
    (enterMax->m_backend).neg = result.m_backend.neg;
    (enterMax->m_backend).fpclass = result.m_backend.fpclass;
    (enterMax->m_backend).prec_elem = result.m_backend.prec_elem;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::getEnterVals
(
   SPxId enterId,
   R& enterTest,
   R& enterUB,
   R& enterLB,
   R& enterVal,
   R& enterMax,
   R& enterPric,
   typename SPxBasisBase<R>::Desc::Status& enterStat,
   R& enterRO,
   StableSum<R>& objChange
)
{
   int enterIdx;
   typename SPxBasisBase<R>::Desc& ds = this->desc();

   if(enterId.isSPxColId())
   {
      enterIdx = this->number(SPxColId(enterId));
      enterStat = ds.colStatus(enterIdx);
      assert(!isBasic(enterStat));

      /*      For an #Id# to enter the basis we better recompute the Test value.
       */
      if(rep() == COLUMN)
      {
         computePvec(enterIdx);
         enterTest = computeTest(enterIdx);
         theTest[enterIdx] = 0;
      }
      else
      {
         enterTest = coTest()[enterIdx];
         theCoTest[enterIdx] = 0;
      }

      switch(enterStat)
      {
      // primal/columnwise cases:
      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == COLUMN);
         enterUB = theUCbound[enterIdx];
         enterLB = theLCbound[enterIdx];
         enterVal = enterUB;
         enterMax = enterLB - enterUB;
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->maxObj(enterIdx);
         objChange -= enterVal * enterRO;

         if(enterLB <= R(-infinity))
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_LOWER;
         else if(EQ(enterLB, enterUB, this->epsilon()))
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_FREE;
         else
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_BOTH;

         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == COLUMN);
         enterUB = theUCbound[enterIdx];
         enterLB = theLCbound[enterIdx];
         enterVal = enterLB;
         enterMax = enterUB - enterLB;
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->maxObj(enterIdx);
         objChange -= enterVal * enterRO;

         if(enterUB >= R(infinity))
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_UPPER;
         else if(EQ(enterLB, enterUB, this->epsilon()))
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_FREE;
         else
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_BOTH;

         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == COLUMN);
         enterUB = theUCbound[enterIdx];
         enterLB = theLCbound[enterIdx];
         enterVal = 0;
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->maxObj(enterIdx);
         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_UNDEFINED;
         enterMax = (enterRO - enterPric > 0) ? R(infinity) : R(-infinity);
         break;

      // dual/rowwise cases:
      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == ROW);
         assert(theUCbound[enterIdx] < R(infinity));
         enterUB = theUCbound[enterIdx];
         enterLB = R(-infinity);
         enterMax = R(-infinity);
         enterVal = enterUB;
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = SPxLPBase<R>::lower(enterIdx);
         objChange -= enterRO * enterVal;
         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == ROW);
         assert(theLCbound[enterIdx] > R(-infinity));
         enterLB = theLCbound[enterIdx];
         enterUB = R(infinity);
         enterMax = R(infinity);
         enterVal = enterLB;
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = SPxLPBase<R>::upper(enterIdx);
         objChange -= enterRO * enterVal;
         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         break;

      case SPxBasisBase<R>::Desc::D_FREE:
         assert(rep() == ROW);
         assert(SPxLPBase<R>::lower(enterIdx) == SPxLPBase<R>::upper(enterIdx));
         enterUB = R(infinity);
         enterLB = R(-infinity);
         enterVal = 0;
         enterRO = SPxLPBase<R>::upper(enterIdx);
         enterPric = (*theCoPvec)[enterIdx];

         if(enterPric > enterRO)
            enterMax = R(infinity);
         else
            enterMax = R(-infinity);

         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == ROW);
         enterPric = (*theCoPvec)[enterIdx];

         if(enterPric > SPxLPBase<R>::upper(enterIdx))
         {
            enterLB = theLCbound[enterIdx];
            enterUB = R(infinity);
            enterMax = R(infinity);
            enterVal = enterLB;
            enterRO = SPxLPBase<R>::upper(enterIdx);
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         }
         else
         {
            enterUB = theUCbound[enterIdx];
            enterVal = enterUB;
            enterRO = SPxLPBase<R>::lower(enterIdx);
            enterLB = R(-infinity);
            enterMax = R(-infinity);
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         }

         objChange -= theLCbound[enterIdx] * SPxLPBase<R>::upper(enterIdx);
         objChange -= theUCbound[enterIdx] * SPxLPBase<R>::lower(enterIdx);
         break;

      default:
         throw SPxInternalCodeException("XENTER01 This should never happen.");
      }

      SPxOut::debug(this, "DENTER03 SPxSolverBase::getEnterVals() : col {}: {} -> {} objChange: {}\n",
                    enterIdx, enterStat, ds.colStatus(enterIdx), objChange);
   }

   else
   {
      assert(enterId.isSPxRowId());
      enterIdx = this->number(SPxRowId(enterId));
      enterStat = ds.rowStatus(enterIdx);
      assert(!isBasic(enterStat));

      /*      For an #Id# to enter the basis we better recompute the Test value.
       */
      if(rep() == ROW)
      {
         computePvec(enterIdx);
         enterTest = computeTest(enterIdx);
         theTest[enterIdx] = 0;
      }
      else
      {
         enterTest = coTest()[enterIdx];
         theCoTest[enterIdx] = 0;
      }

      switch(enterStat)
      {
      // primal/columnwise cases:
      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == COLUMN);
         enterUB = theURbound[enterIdx];
         enterLB = theLRbound[enterIdx];
         enterVal = enterLB;
         enterMax = enterUB - enterLB;
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = this->maxRowObj(enterIdx);
         objChange -= enterRO * enterVal;

         if(enterUB >= R(infinity))
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_LOWER;
         else if(EQ(enterLB, enterUB, this->epsilon()))
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_FREE;
         else
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_BOTH;

         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == COLUMN);
         enterUB = theURbound[enterIdx];
         enterLB = theLRbound[enterIdx];
         enterVal = enterUB;
         enterMax = enterLB - enterUB;
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = this->maxRowObj(enterIdx);
         objChange -= enterRO * enterVal;

         if(enterLB <= R(-infinity))
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_UPPER;
         else if(EQ(enterLB, enterUB, this->epsilon()))
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_FREE;
         else
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_BOTH;

         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == COLUMN);
#if 1
         throw SPxInternalCodeException("XENTER02 This should never happen.");
#else
         SPX_MSG_ERROR(std::cerr << "EENTER99 ERROR: not yet debugged!" << std::endl;)
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = this->maxRowObj(enterIdx);
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_UNDEFINED;
#endif
         break;

      // dual/rowwise cases:
      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == ROW);
         assert(theURbound[enterIdx] < R(infinity));
         enterUB = theURbound[enterIdx];
         enterLB = R(-infinity);
         enterVal = enterUB;
         enterMax = R(-infinity);
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->lhs(enterIdx);
         objChange -= enterRO * enterVal;
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == ROW);
         assert(theLRbound[enterIdx] > R(-infinity));
         enterLB = theLRbound[enterIdx];
         enterUB = R(infinity);
         enterVal = enterLB;
         enterMax = R(infinity);
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->rhs(enterIdx);
         objChange -= enterRO * enterVal;
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         break;

      case SPxBasisBase<R>::Desc::D_FREE:
         assert(rep() == ROW);
         assert(this->rhs(enterIdx) == this->lhs(enterIdx));
         enterUB = R(infinity);
         enterLB = R(-infinity);
         enterVal = 0;
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->rhs(enterIdx);
         enterMax = (enterPric > enterRO) ? R(infinity) : R(-infinity);
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == ROW);
         enterPric = (*thePvec)[enterIdx];

         if(enterPric > this->rhs(enterIdx))
         {
            enterLB = theLRbound[enterIdx];
            enterVal = enterLB;
            enterUB = R(infinity);
            enterMax = R(infinity);
            enterRO = this->rhs(enterIdx);
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         }
         else
         {
            enterUB = theURbound[enterIdx];
            enterVal = enterUB;
            enterLB = R(-infinity);
            enterMax = R(-infinity);
            enterRO = this->lhs(enterIdx);
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         }

         objChange -= theLRbound[enterIdx] * this->rhs(enterIdx);
         objChange -= theURbound[enterIdx] * this->lhs(enterIdx);
         break;

      default:
         throw SPxInternalCodeException("XENTER03 This should never happen.");
      }

      SPxOut::debug(this, "DENTER05 SPxSolverBase::getEnterVals() : row {}: {} -> {} objChange: {}\n",
                    enterIdx, enterStat, ds.rowStatus(enterIdx), objChange);
   }
}